

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_bubble.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int j;
  long lVar4;
  int __tmp;
  int iVar5;
  int i;
  long lVar6;
  int arr [4524];
  undefined8 uStack_fc0;
  int local_fb8 [1002];
  
  iVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uStack_fc0 = 0x101204;
      iVar3 = rand();
      local_fb8[lVar6] = iVar3 % 100;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 1000);
    bVar2 = true;
    lVar6 = 0;
    do {
      do {
        iVar3 = local_fb8[lVar6];
        if (local_fb8[lVar6 + 1] < iVar3) {
          local_fb8[lVar6] = local_fb8[lVar6 + 1];
          local_fb8[lVar6 + 1] = iVar3;
          bVar2 = false;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 999);
      lVar6 = 0;
      bVar1 = !bVar2;
      bVar2 = true;
    } while (bVar1);
    lVar6 = 4;
    do {
      lVar4 = lVar6;
      if (lVar4 == 4000) goto LAB_00101284;
      lVar6 = lVar4 + 4;
    } while (*(int *)((long)&uStack_fc0 + lVar4 + 4) <= *(int *)((long)local_fb8 + lVar4));
    if (lVar4 != 4000) {
      uStack_fc0 = 0x1012d3;
      __assert_fail("std::is_sorted(arr, arr + n)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wasimusu[P]cpp_algorithms/sorting/sort_bubble.cpp"
                    ,0x42,"int main()");
    }
LAB_00101284:
    iVar5 = iVar5 + 1;
    if (iVar5 == 100) {
      uStack_fc0 = 0x1012a7;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Successfully sorted using bubble sort! \n",0x28);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    int n = 1000;
    int arr[n];
    for (int _ = 0; _ < 100; _++) {
        generate_random_arrs(arr, n);
        bubble_sort(arr, n);
        assert(std::is_sorted(arr, arr + n));
    }
    std::cout << "Successfully sorted using bubble sort! \n";
    return 0;
}